

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O1

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::SimpleInputStream::tryRead
          (SimpleInputStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  ulong in_R8;
  ulong __n;
  Own<kj::_::ImmediatePromiseNode<unsigned_long>_> OVar1;
  Promise<unsigned_long> PVar2;
  size_t local_30;
  _func_int **local_28;
  uchar *puStack_20;
  
  __n = *(ulong *)((long)buffer + 0x10);
  if (in_R8 < *(ulong *)((long)buffer + 0x10)) {
    __n = in_R8;
  }
  memcpy((void *)minBytes,*(void **)((long)buffer + 8),__n);
  *(long *)((long)buffer + 8) = *(long *)((long)buffer + 8) + __n;
  *(long *)((long)buffer + 0x10) = *(long *)((long)buffer + 0x10) - __n;
  local_30 = __n;
  OVar1 = heap<kj::_::ImmediatePromiseNode<unsigned_long>,unsigned_long>((kj *)&local_28,&local_30);
  PVar2.super_PromiseBase.node.ptr = OVar1.ptr;
  (this->super_AsyncInputStream)._vptr_AsyncInputStream = local_28;
  (this->unread).ptr = puStack_20;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    size_t amount = kj::min(maxBytes, unread.size());
    memcpy(buffer, unread.begin(), amount);
    unread = unread.slice(amount, unread.size());
    return amount;
  }